

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O2

qint64 QBenchmarkValgrindUtils::extractLastResult(void)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  getNewestFileName();
  qVar1 = extractResult((QString *)&QStack_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractLastResult()
{
    return extractResult(getNewestFileName());
}